

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  StorageClass SVar1;
  bool bVar2;
  uint32_t uVar3;
  BaseType input_type;
  BaseType BVar4;
  GLSLstd450 GVar5;
  uint32_t uVar6;
  SPIRType *pSVar7;
  SPIRExpression *pSVar8;
  mapped_type *pmVar9;
  char *pcVar10;
  SPIRConstant *pSVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string *psVar13;
  char (*ts_2) [3];
  uint32_t op2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  string local_d8;
  string component;
  string local_98;
  uint32_t id_local;
  string local_70;
  string local_50;
  
  ts_2 = (char (*) [3])args;
  id_local = id;
  uVar3 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  input_type = to_signed_basetype(uVar3);
  BVar4 = to_unsigned_basetype(uVar3);
  GVar5 = CompilerGLSL::get_remapped_glsl_op(&this->super_CompilerGLSL,eop);
  pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
  switch(GVar5) {
  case GLSLstd450RoundEven:
    uVar3 = *args;
    pcVar10 = "rint";
    break;
  default:
    goto LAB_001ebd53;
  case GLSLstd450Sinh:
    if (pSVar7->basetype == Half) {
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                (&local_d8,&this->super_CompilerGLSL,*args,true);
      join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
                (&component,(spirv_cross *)"half(fast::sinh(",(char (*) [17])&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x291df3,ts_2)
      ;
      ::std::__cxx11::string::~string((string *)&local_d8);
      bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&component,bVar2,false);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
      goto LAB_001ec20a;
    }
    uVar3 = *args;
    pcVar10 = "fast::sinh";
    break;
  case GLSLstd450Cosh:
    if (pSVar7->basetype == Half) {
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                (&local_d8,&this->super_CompilerGLSL,*args,true);
      join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
                (&component,(spirv_cross *)"half(fast::cosh(",(char (*) [17])&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x291df3,ts_2)
      ;
      ::std::__cxx11::string::~string((string *)&local_d8);
      bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&component,bVar2,false);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
      goto LAB_001ec20a;
    }
    uVar3 = *args;
    pcVar10 = "fast::cosh";
    break;
  case GLSLstd450Tanh:
    if (pSVar7->basetype == Half) {
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                (&local_d8,&this->super_CompilerGLSL,*args,true);
      join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
                (&component,(spirv_cross *)"half(fast::tanh(",(char (*) [17])&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x291df3,ts_2)
      ;
      ::std::__cxx11::string::~string((string *)&local_d8);
      bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&component,bVar2,false);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
      goto LAB_001ec20a;
    }
    uVar3 = *args;
    pcVar10 = "precise::tanh";
    break;
  case GLSLstd450Atan2:
    if (pSVar7->basetype != Half) {
      uVar3 = *args;
      uVar6 = args[1];
      pcVar10 = "precise::atan2";
      goto LAB_001ebded;
    }
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_98,&this->super_CompilerGLSL,args[1],true);
    join<char_const(&)[18],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&component,(spirv_cross *)"half(fast::atan2(",(char (*) [18])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x294843,
               (char (*) [3])&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x291df3,
               (char (*) [3])in_stack_fffffffffffffef8);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_d8);
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar2) {
      bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar2 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&component,bVar2,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,args[1]);
    goto LAB_001ec20a;
  case GLSLstd450Pow:
    uVar3 = *args;
    uVar6 = args[1];
    pcVar10 = "powr";
    goto LAB_001ebded;
  case GLSLstd450InverseSqrt:
    uVar3 = *args;
    pcVar10 = "rsqrt";
    break;
  case GLSLstd450MatrixInverse:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar3 = pSVar7->columns;
    if (uVar3 == 4) {
      uVar3 = *args;
      pcVar10 = "spvInverse4x4";
    }
    else if (uVar3 == 3) {
      uVar3 = *args;
      pcVar10 = "spvInverse3x3";
    }
    else {
      if (uVar3 != 2) {
        return;
      }
      uVar3 = *args;
      pcVar10 = "spvInverse2x2";
    }
    break;
  case GLSLstd450Modf:
  case GLSLstd450Frexp:
    pSVar8 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,args[1]);
    pSVar7 = Compiler::expression_type((Compiler *)this,args[1]);
    SVar1 = pSVar7->storage;
    if (((SVar1 - StorageClassPrivate < 3) || (SVar1 == StorageClassInput)) ||
       ((SVar1 == StorageClassOutput && (this->capture_output_to_buffer == false)))) {
      if ((pSVar8 == (SPIRExpression *)0x0) || (pSVar8->access_chain != true)) goto LAB_001ebd53;
      pSVar7 = Compiler::expression_type((Compiler *)this,args[1]);
      bVar2 = Compiler::is_scalar((Compiler *)this,pSVar7);
      if (!bVar2) goto LAB_001ebd53;
    }
    CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
    ::std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,&id_local);
    pmVar9 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).extra_sub_expressions,&id_local);
    if (*pmVar9 == 0) {
      uVar3 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      *pmVar9 = uVar3;
    }
    uVar3 = Compiler::expression_type_id((Compiler *)this,args[1]);
    uVar3 = Compiler::get_pointee_type_id((Compiler *)this,uVar3);
    CompilerGLSL::emit_uninitialized_temporary_expression(&this->super_CompilerGLSL,uVar3,*pmVar9);
    pcVar10 = "frexp";
    if (eop == 0x23) {
      pcVar10 = "modf";
    }
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type,id_local,*args,*pmVar9,pcVar10);
    CompilerGLSL::to_expression_abi_cxx11_(&component,&this->super_CompilerGLSL,args[1],true);
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*pmVar9,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&component,(char (*) [4])0x297dc7,&local_d8,
               (char (*) [2])0x297c5b);
    psVar13 = &local_d8;
    goto LAB_001ec205;
  case GLSLstd450FMin:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar3 = *args;
    uVar6 = args[1];
    if (pSVar7->basetype == Float) {
      pcVar10 = "fast::min";
      goto LAB_001ebded;
    }
    goto LAB_001eba5e;
  case GLSLstd450FMax:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar3 = *args;
    uVar6 = args[1];
    if (pSVar7->basetype == Float) {
      pcVar10 = "fast::max";
      goto LAB_001ebded;
    }
    goto LAB_001eb8e7;
  case GLSLstd450FClamp:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar3 = *args;
    uVar6 = args[1];
    op2 = args[2];
    if (pSVar7->basetype == Float) {
      pcVar10 = "fast::clamp";
      goto LAB_001eba9e;
    }
    goto LAB_001eb898;
  case GLSLstd450PackSnorm4x8:
    uVar3 = *args;
    pcVar10 = "pack_float_to_snorm4x8";
    break;
  case GLSLstd450PackUnorm4x8:
    uVar3 = *args;
    pcVar10 = "pack_float_to_unorm4x8";
    break;
  case GLSLstd450PackSnorm2x16:
    uVar3 = *args;
    pcVar10 = "pack_float_to_snorm2x16";
    break;
  case GLSLstd450PackUnorm2x16:
    uVar3 = *args;
    pcVar10 = "pack_float_to_unorm2x16";
    break;
  case GLSLstd450PackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              (&component,(spirv_cross *)"as_type<uint>(half2(",(char (*) [21])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x291df3,ts_2);
    ::std::__cxx11::string::~string((string *)&local_d8);
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&component,bVar2,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    goto LAB_001ec20a;
  case GLSLstd450PackDouble2x32:
    uVar3 = *args;
    pcVar10 = "unsupported_GLSLstd450PackDouble2x32";
    break;
  case GLSLstd450UnpackSnorm2x16:
    uVar3 = *args;
    pcVar10 = "unpack_snorm2x16_to_float";
    break;
  case GLSLstd450UnpackUnorm2x16:
    uVar3 = *args;
    pcVar10 = "unpack_unorm2x16_to_float";
    break;
  case GLSLstd450UnpackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (&component,(spirv_cross *)"float2(as_type<half2>(",(char (*) [23])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x291df3,ts_2);
    ::std::__cxx11::string::~string((string *)&local_d8);
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&component,bVar2,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    goto LAB_001ec20a;
  case GLSLstd450UnpackSnorm4x8:
    uVar3 = *args;
    pcVar10 = "unpack_snorm4x8_to_float";
    break;
  case GLSLstd450UnpackUnorm4x8:
    uVar3 = *args;
    pcVar10 = "unpack_unorm4x8_to_float";
    break;
  case GLSLstd450UnpackDouble2x32:
    uVar3 = *args;
    pcVar10 = "unsupported_GLSLstd450UnpackDouble2x32";
    break;
  case GLSLstd450Length:
    pSVar7 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar7->vecsize != 1) goto LAB_001ebd53;
    uVar3 = *args;
    pcVar10 = "abs";
    break;
  case GLSLstd450Distance:
    pSVar7 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar7->vecsize == 1) {
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_d8,&this->super_CompilerGLSL,*args,true);
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_98,&this->super_CompilerGLSL,args[1],true);
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&component,(spirv_cross *)"abs(",(char (*) [5])&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2836d7,
                 (char (*) [4])&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
                 (char (*) [2])in_stack_fffffffffffffef8);
      bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      if (bVar2) {
        bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      else {
        bVar2 = false;
      }
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&component,bVar2,false);
      ::std::__cxx11::string::~string((string *)&component);
      ::std::__cxx11::string::~string((string *)&local_98);
      ::std::__cxx11::string::~string((string *)&local_d8);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,args[1]);
      return;
    }
    goto LAB_001ebd53;
  case GLSLstd450Normalize:
    pSVar7 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar7->vecsize == 1) {
      uVar3 = *args;
      pcVar10 = "sign";
    }
    else {
      uVar3 = *args;
      if ((pSVar7->vecsize < 4) && (pSVar7->basetype == Half)) {
        pcVar10 = "normalize";
      }
      else {
        pcVar10 = "fast::normalize";
      }
    }
    break;
  case GLSLstd450FaceForward:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if (pSVar7->vecsize == 1) {
      uVar3 = *args;
      uVar6 = args[1];
      op2 = args[2];
      pcVar10 = "spvFaceForward";
      goto LAB_001eba9e;
    }
    goto LAB_001ebd53;
  case GLSLstd450Reflect:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if (pSVar7->vecsize == 1) {
      uVar3 = *args;
      uVar6 = args[1];
      pcVar10 = "spvReflect";
      goto LAB_001ebded;
    }
    goto LAB_001ebd53;
  case GLSLstd450Refract:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if (pSVar7->vecsize == 1) {
      uVar3 = *args;
      uVar6 = args[1];
      op2 = args[2];
      pcVar10 = "spvRefract";
      goto LAB_001eba9e;
    }
LAB_001ebd53:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    return;
  case GLSLstd450FindILsb:
    pSVar7 = Compiler::expression_type((Compiler *)this,*args);
    input_type = pSVar7->basetype;
    uVar3 = *args;
    pcVar10 = "spvFindLSB";
    goto LAB_001eb762;
  case GLSLstd450FindSMsb:
    uVar3 = *args;
    pcVar10 = "spvFindSMSB";
    goto LAB_001eb762;
  case GLSLstd450FindUMsb:
    uVar3 = *args;
    pcVar10 = "spvFindUMSB";
    input_type = BVar4;
LAB_001eb762:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,uVar3,pcVar10,input_type,input_type);
    return;
  case GLSLstd450InterpolateAtCentroid:
    uVar3 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    paVar12 = &component.field_2;
    component._M_string_length = 0;
    component.field_2._M_local_buf[0] = '\0';
    component._M_dataplus._M_p = (pointer)paVar12;
    bVar2 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar2) {
      uVar6 = Compiler::get_extended_decoration
                        ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      pSVar11 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar6);
      if ((pSVar11 == (SPIRConstant *)0x0) || (pSVar11->specialization == true)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar6,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)0x2828da,(char (*) [2])&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2827df,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&component,(string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        psVar13 = &local_98;
      }
      else {
        local_98._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar11->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d8,(spirv_cross *)0x27e361,(char (*) [2])&local_98,
                   (char **)&paVar12->_M_allocated_capacity);
        psVar13 = &local_d8;
        ::std::__cxx11::string::operator=((string *)&component,(string *)psVar13);
      }
      ::std::__cxx11::string::~string((string *)psVar13);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar7 = get_stage_in_struct_type(this);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar7,uVar3);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[27],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e361,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_centroid()",(char (*) [27])&component,in_stack_fffffffffffffef8);
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d8,bVar2,false);
    psVar13 = &local_d8;
    goto LAB_001ec1ee;
  case GLSLstd450InterpolateAtSample:
    uVar3 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    paVar12 = &component.field_2;
    component._M_string_length = 0;
    component.field_2._M_local_buf[0] = '\0';
    component._M_dataplus._M_p = (pointer)paVar12;
    bVar2 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar2) {
      uVar6 = Compiler::get_extended_decoration
                        ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      pSVar11 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar6);
      if ((pSVar11 == (SPIRConstant *)0x0) || (pSVar11->specialization == true)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar6,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)0x2828da,(char (*) [2])&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2827df,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&component,(string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        psVar13 = &local_98;
      }
      else {
        local_98._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar11->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d8,(spirv_cross *)0x27e361,(char (*) [2])&local_98,
                   (char **)&paVar12->_M_allocated_capacity);
        psVar13 = &local_d8;
        ::std::__cxx11::string::operator=((string *)&component,(string *)psVar13);
      }
      ::std::__cxx11::string::~string((string *)psVar13);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(this->stage_in_var_id).id,1);
    uVar6 = id;
    pSVar7 = get_stage_in_struct_type(this);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar7,uVar3);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e361,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_sample(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
               (char (*) [2])&component,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(result_type,uVar6));
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar2) {
      bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar2 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d8,bVar2,false);
    goto LAB_001ec1dc;
  case GLSLstd450InterpolateAtOffset:
    uVar3 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    paVar12 = &component.field_2;
    component._M_string_length = 0;
    component.field_2._M_local_buf[0] = '\0';
    component._M_dataplus._M_p = (pointer)paVar12;
    bVar2 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar2) {
      uVar6 = Compiler::get_extended_decoration
                        ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      pSVar11 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar6);
      if ((pSVar11 == (SPIRConstant *)0x0) || (pSVar11->specialization == true)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar6,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)0x2828da,(char (*) [2])&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2827df,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&component,(string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        psVar13 = &local_98;
      }
      else {
        local_98._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar11->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d8,(spirv_cross *)0x27e361,(char (*) [2])&local_98,
                   (char **)&paVar12->_M_allocated_capacity);
        psVar13 = &local_d8;
        ::std::__cxx11::string::operator=((string *)&component,(string *)psVar13);
      }
      ::std::__cxx11::string::~string((string *)psVar13);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(this->stage_in_var_id).id,1);
    uVar6 = id;
    pSVar7 = get_stage_in_struct_type(this);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar7,uVar3);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[11],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e361,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_offset(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + 0.4375)",
               (char (*) [11])&component,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(result_type,uVar6));
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar2) {
      bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar2 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d8,bVar2,false);
LAB_001ec1dc:
    ::std::__cxx11::string::~string((string *)&local_d8);
    psVar13 = &local_50;
LAB_001ec1ee:
    ::std::__cxx11::string::~string((string *)psVar13);
    ::std::__cxx11::string::~string((string *)&local_70);
    psVar13 = &local_98;
LAB_001ec205:
    ::std::__cxx11::string::~string((string *)psVar13);
LAB_001ec20a:
    ::std::__cxx11::string::~string((string *)&component);
    return;
  case GLSLstd450NMin:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar3 = *args;
    uVar6 = args[1];
    if (pSVar7->basetype == Float) {
      pcVar10 = "precise::min";
      goto LAB_001ebded;
    }
LAB_001eba5e:
    pcVar10 = "min";
LAB_001ebded:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,result_type,id,uVar3,uVar6,pcVar10);
    return;
  case GLSLstd450NMax:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar3 = *args;
    uVar6 = args[1];
    if (pSVar7->basetype == Float) {
      pcVar10 = "precise::max";
      goto LAB_001ebded;
    }
LAB_001eb8e7:
    pcVar10 = "max";
    goto LAB_001ebded;
  case GLSLstd450NClamp:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar3 = *args;
    uVar6 = args[1];
    op2 = args[2];
    if (pSVar7->basetype == Float) {
      pcVar10 = "precise::clamp";
      goto LAB_001eba9e;
    }
LAB_001eb898:
    pcVar10 = "clamp";
LAB_001eba9e:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,uVar3,uVar6,op2,pcVar10);
    return;
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,uVar3,pcVar10);
  return;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	op = get_remapped_glsl_op(op);

	auto &restype = get<SPIRType>(result_type);

	switch (op)
	{
	case GLSLstd450Sinh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::sinh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "fast::sinh");
		break;
	case GLSLstd450Cosh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::cosh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "fast::cosh");
		break;
	case GLSLstd450Tanh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::tanh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "precise::tanh");
		break;
	case GLSLstd450Atan2:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::atan2(", to_unpacked_expression(args[0]), ", ", to_unpacked_expression(args[1]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

	case GLSLstd450InterpolateAtCentroid:
	{
		// We can't just emit the expression normally, because the qualified name contains a call to the default
		// interpolate method, or refers to a local variable. We saved the interface index we need; use it to construct
		// the base for the method call.
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_centroid()", component),
		        should_forward(args[0]));
		break;
	}

	case GLSLstd450InterpolateAtSample:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_sample(", to_expression(args[1]), ")", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450InterpolateAtOffset:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		// Like Direct3D, Metal puts the (0, 0) at the upper-left corner, not the center as SPIR-V and GLSL do.
		// Offset the offset by (1/2 - 1/16), or 0.4375, to compensate for this.
		// It has to be (1/2 - 1/16) and not 1/2, or several CTS tests subtly break on Intel.
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_offset(", to_expression(args[1]), " + 0.4375)", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions, so use abs().
		if (expression_type(args[0]).vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "abs");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
	{
		auto &exp_type = expression_type(args[0]);
		// MSL does not support scalar versions here.
		// MSL has no implementation for normalize in the fast:: namespace for half2 and half3
		// Returns -1 or 1 for valid input, sign() does the job.
		if (exp_type.vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "sign");
		else if (exp_type.vecsize <= 3 && exp_type.basetype == SPIRType::Half)
			emit_unary_func_op(result_type, id, args[0], "normalize");
		else
			emit_unary_func_op(result_type, id, args[0], "fast::normalize");
		break;
	}
	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		// Another special case is if the variable is in a storage class which is not thread.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		auto &type = expression_type(args[1]);

		bool is_thread_storage = storage_class_array_is_thread(type.storage);
		if (type.storage == StorageClassOutput && capture_output_to_buffer)
			is_thread_storage = false;

		if (!is_thread_storage ||
		    (ptr && ptr->access_chain && is_scalar(expression_type(args[1]))))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(expression_type_id(args[1]));
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	case GLSLstd450Pow:
		// powr makes x < 0.0 undefined, just like SPIR-V.
		emit_binary_func_op(result_type, id, args[0], args[1], "powr");
		break;

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}